

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# best_q.c
# Opt level: O3

float64 best_q(float32 ****mixw,float32 ****means,float32 ****vars,uint32 *veclen,uint32 n_model,
              uint32 n_state,uint32 n_stream,uint32 n_density,float32 *stwt,uint32 **dfeat,
              uint32 n_dfeat,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 *id,uint32 n_id,
              float32 ***dist,float64 node_wt_ent,quest_t **out_best_q)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  float32 *pfVar4;
  float *pfVar5;
  float32 *pfVar6;
  long lVar7;
  double dVar8;
  float64 fVar9;
  float64 fVar10;
  undefined1 auVar11 [16];
  double dVar12;
  int iVar13;
  int iVar14;
  cmd_ln_t *pcVar15;
  char *__s1;
  ulong uVar16;
  undefined8 *inptr;
  undefined8 *inptr_00;
  ulong uVar17;
  void *ptr;
  void *ptr_00;
  size_t sVar18;
  size_t sVar19;
  ulong uVar20;
  quest_t *pqVar21;
  uint uVar22;
  ulong d1;
  size_t d2;
  size_t __n;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  ulong local_130;
  uint local_124;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  uint local_dc;
  uint local_d8;
  float local_d4;
  size_t local_d0;
  ulong local_c8;
  double dStack_b0;
  ulong local_98;
  
  pcVar15 = cmd_ln_get();
  __s1 = cmd_ln_str_r(pcVar15,"-ts2cbfn");
  iVar13 = strcmp(__s1,".semi.");
  if ((iVar13 != 0) && (iVar13 = strcmp(__s1,".cont."), iVar13 != 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
            ,0x67,"Type %s unsupported; trees can only be built on types .semi. or .cont.\n",__s1);
    exit(1);
  }
  iVar13 = strcmp(__s1,".cont.");
  d1 = (ulong)n_state;
  if (iVar13 == 0) {
    pcVar15 = cmd_ln_get();
    dVar30 = cmd_ln_float_r(pcVar15,"-varfloor");
    local_d0 = 0;
    if (n_stream == 0) {
      d2 = 0;
    }
    else {
      d2 = (size_t)n_stream;
      uVar16 = 0;
      do {
        uVar22 = (int)local_d0 + veclen[uVar16];
        local_d0 = (size_t)uVar22;
        uVar16 = uVar16 + 1;
      } while (d2 != uVar16);
      local_d0 = (size_t)uVar22;
    }
    local_d4 = (float)dVar30;
    local_f8 = (undefined8 *)
               __ckd_calloc_3d__(d1,d2,local_d0,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                 ,0x71);
    local_100 = (undefined8 *)
                __ckd_calloc_3d__(d1,d2,local_d0,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                  ,0x72);
    local_108 = (undefined8 *)
                __ckd_calloc_3d__(d1,d2,local_d0,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                  ,0x73);
    local_110 = (undefined8 *)
                __ckd_calloc_3d__(d1,d2,local_d0,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                  ,0x74);
  }
  else {
    d2 = (size_t)n_stream;
    local_d4 = 0.0;
    local_108 = (undefined8 *)0x0;
    local_110 = (undefined8 *)0x0;
    local_100 = (undefined8 *)0x0;
    local_f8 = (undefined8 *)0x0;
    local_d0 = 0;
  }
  uVar16 = (ulong)n_density;
  inptr = (undefined8 *)
          __ckd_calloc_3d__(d1,d2,uVar16,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                            ,0x79);
  inptr_00 = (undefined8 *)
             __ckd_calloc_3d__(d1,d2,uVar16,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                               ,0x7a);
  if (n_all_q != 0) {
    local_98 = 0;
    lVar1 = d1 * d2 * 4;
    sVar18 = local_d0 * lVar1;
    __n = lVar1 * uVar16;
    bVar25 = n_state == 0;
    dVar30 = -1e+50;
    local_c8 = 0;
    local_d8 = 0;
    local_dc = 0;
    do {
      memset(*(void **)*inptr,0,__n);
      memset(*(void **)*inptr_00,0,__n);
      if (iVar13 == 0) {
        memset(*(void **)*local_f8,0,sVar18);
        memset(*(void **)*local_100,0,sVar18);
        memset(*(void **)*local_108,0,sVar18);
        memset(*(void **)*local_110,0,sVar18);
      }
      if (n_id != 0) {
        uVar20 = 0;
        local_124 = 0;
        uVar22 = 0;
        do {
          uVar2 = id[uVar20];
          iVar14 = eval_quest(all_q + local_c8,dfeat[uVar2],n_dfeat);
          if (iVar14 == 0) {
            if (n_state != 0) {
              uVar17 = 0;
              do {
                if (n_stream != 0) {
                  sVar19 = 0;
                  do {
                    if (n_density != 0) {
                      pfVar4 = mixw[uVar2][uVar17][sVar19];
                      lVar1 = *(long *)(inptr_00[uVar17] + sVar19 * 8);
                      uVar23 = 0;
                      do {
                        *(float *)(lVar1 + uVar23 * 4) =
                             (float)pfVar4[uVar23] + *(float *)(lVar1 + uVar23 * 4);
                        uVar23 = uVar23 + 1;
                      } while (uVar16 != uVar23);
                    }
                    sVar19 = sVar19 + 1;
                  } while (sVar19 != d2);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != d1);
              if (iVar13 == 0 && !bVar25) {
                uVar17 = 0;
                do {
                  if (n_stream != 0) {
                    sVar19 = 0;
                    do {
                      uVar3 = veclen[sVar19];
                      if ((ulong)uVar3 != 0) {
                        pfVar5 = (float *)mixw[uVar2][uVar17][sVar19];
                        pfVar4 = means[uVar2][uVar17][sVar19];
                        lVar1 = *(long *)(local_108[uVar17] + sVar19 * 8);
                        pfVar6 = vars[uVar2][uVar17][sVar19];
                        lVar7 = *(long *)(local_110[uVar17] + sVar19 * 8);
                        uVar23 = 0;
                        do {
                          *(float *)(lVar1 + uVar23 * 4) =
                               *pfVar5 * (float)pfVar4[uVar23] + *(float *)(lVar1 + uVar23 * 4);
                          fVar26 = (float)pfVar4[uVar23];
                          *(float *)(lVar7 + uVar23 * 4) =
                               (fVar26 * fVar26 + (float)pfVar6[uVar23]) * *pfVar5 +
                               *(float *)(lVar7 + uVar23 * 4);
                          uVar23 = uVar23 + 1;
                        } while (uVar3 != uVar23);
                      }
                      sVar19 = sVar19 + 1;
                    } while (sVar19 != d2);
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar17 != d1);
              }
            }
            local_124 = local_124 + 1;
          }
          else {
            if (n_state != 0) {
              uVar17 = 0;
              do {
                if (n_stream != 0) {
                  sVar19 = 0;
                  do {
                    if (n_density != 0) {
                      pfVar4 = mixw[uVar2][uVar17][sVar19];
                      lVar1 = *(long *)(inptr[uVar17] + sVar19 * 8);
                      uVar23 = 0;
                      do {
                        *(float *)(lVar1 + uVar23 * 4) =
                             (float)pfVar4[uVar23] + *(float *)(lVar1 + uVar23 * 4);
                        uVar23 = uVar23 + 1;
                      } while (uVar16 != uVar23);
                    }
                    sVar19 = sVar19 + 1;
                  } while (sVar19 != d2);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != d1);
              if (iVar13 == 0 && !bVar25) {
                uVar17 = 0;
                do {
                  if (n_stream != 0) {
                    sVar19 = 0;
                    do {
                      uVar3 = veclen[sVar19];
                      if ((ulong)uVar3 != 0) {
                        pfVar5 = (float *)mixw[uVar2][uVar17][sVar19];
                        pfVar4 = means[uVar2][uVar17][sVar19];
                        lVar1 = *(long *)(local_f8[uVar17] + sVar19 * 8);
                        pfVar6 = vars[uVar2][uVar17][sVar19];
                        lVar7 = *(long *)(local_100[uVar17] + sVar19 * 8);
                        uVar23 = 0;
                        do {
                          *(float *)(lVar1 + uVar23 * 4) =
                               *pfVar5 * (float)pfVar4[uVar23] + *(float *)(lVar1 + uVar23 * 4);
                          fVar26 = (float)pfVar4[uVar23];
                          *(float *)(lVar7 + uVar23 * 4) =
                               (fVar26 * fVar26 + (float)pfVar6[uVar23]) * *pfVar5 +
                               *(float *)(lVar7 + uVar23 * 4);
                          uVar23 = uVar23 + 1;
                        } while (uVar3 != uVar23);
                      }
                      sVar19 = sVar19 + 1;
                    } while (sVar19 != d2);
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar17 != d1);
              }
            }
            uVar22 = uVar22 + 1;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != n_id);
        if (local_124 != 0 && uVar22 != 0) {
          dVar31 = 0.0;
          bVar24 = bVar25;
          if (n_density != 0 && !bVar25) {
            bVar24 = false;
            uVar20 = 0;
            while( true ) {
              uVar17 = 0;
              dVar8 = 0.0;
              do {
                dVar8 = dVar8 + (double)*(float *)(*(long *)inptr[uVar20] + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar16 != uVar17);
              if ((dVar8 == 0.0) && (!NAN(dVar8))) break;
              dVar32 = 1.0 / dVar8;
              if (n_stream != 0) {
                sVar19 = 0;
                do {
                  if (n_density != 0) {
                    lVar1 = *(long *)(inptr[uVar20] + sVar19 * 8);
                    uVar17 = 0;
                    do {
                      *(float *)(lVar1 + uVar17 * 4) =
                           (float)((double)*(float *)(lVar1 + uVar17 * 4) * dVar32);
                      uVar17 = uVar17 + 1;
                    } while (uVar16 != uVar17);
                  }
                  sVar19 = sVar19 + 1;
                } while (sVar19 != d2);
              }
              if (n_density == 0) break;
              dVar33 = 0.0;
              uVar17 = 0;
              do {
                dVar33 = dVar33 + (double)*(float *)(*(long *)inptr_00[uVar20] + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar16 != uVar17);
              if ((dVar33 == 0.0) && (!NAN(dVar33))) break;
              if (n_stream == 0) {
                if (iVar13 == 0) {
LAB_00111c21:
                  dStack_b0 = 0.0;
                  goto LAB_00111c25;
                }
LAB_00111bab:
                fVar26 = (float)stwt[uVar20];
                fVar9 = wt_ent_inc((float32 **)inptr[uVar20],(float32)(float)dVar8,
                                   (float32 **)inptr_00[uVar20],(float32)(float)dVar33,dist[uVar20],
                                   n_stream,n_density);
                dStack_b0 = (double)fVar9 * (double)fVar26;
              }
              else {
                dVar34 = 1.0 / dVar33;
                sVar19 = 0;
                do {
                  if (n_density != 0) {
                    lVar1 = *(long *)(inptr_00[uVar20] + sVar19 * 8);
                    uVar17 = 0;
                    do {
                      *(float *)(lVar1 + uVar17 * 4) =
                           (float)((double)*(float *)(lVar1 + uVar17 * 4) * dVar34);
                      uVar17 = uVar17 + 1;
                    } while (uVar16 != uVar17);
                  }
                  sVar19 = sVar19 + 1;
                } while (sVar19 != d2);
                if (iVar13 != 0) goto LAB_00111bab;
                if (n_stream == 0) goto LAB_00111c21;
                dVar12 = 0.0;
                dStack_b0 = 0.0;
                sVar19 = 0;
                do {
                  auVar11._8_4_ = SUB84(dStack_b0,0);
                  auVar11._0_8_ = dVar12;
                  auVar11._12_4_ = (int)((ulong)dStack_b0 >> 0x20);
                  uVar2 = veclen[sVar19];
                  uVar17 = (ulong)uVar2;
                  if (uVar17 != 0) {
                    lVar1 = *(long *)(local_f8[uVar20] + sVar19 * 8);
                    lVar7 = *(long *)(local_100[uVar20] + sVar19 * 8);
                    uVar23 = 0;
                    do {
                      fVar26 = (float)((double)*(float *)(lVar1 + uVar23 * 4) * dVar32);
                      *(float *)(lVar1 + uVar23 * 4) = fVar26;
                      fVar27 = (float)((double)*(float *)(lVar7 + uVar23 * 4) * dVar32 -
                                      (double)(fVar26 * fVar26));
                      fVar26 = local_d4;
                      if (local_d4 <= fVar27) {
                        fVar26 = fVar27;
                      }
                      *(float *)(lVar7 + uVar23 * 4) = fVar26;
                      uVar23 = uVar23 + 1;
                    } while (uVar17 != uVar23);
                    if (uVar17 != 0) {
                      lVar1 = *(long *)(local_108[uVar20] + sVar19 * 8);
                      lVar7 = *(long *)(local_110[uVar20] + sVar19 * 8);
                      uVar23 = 0;
                      do {
                        fVar26 = (float)((double)*(float *)(lVar1 + uVar23 * 4) * dVar34);
                        *(float *)(lVar1 + uVar23 * 4) = fVar26;
                        fVar27 = (float)((double)*(float *)(lVar7 + uVar23 * 4) * dVar34 -
                                        (double)(fVar26 * fVar26));
                        fVar26 = local_d4;
                        if (local_d4 <= fVar27) {
                          fVar26 = fVar27;
                        }
                        *(float *)(lVar7 + uVar23 * 4) = fVar26;
                        uVar23 = uVar23 + 1;
                      } while (uVar17 != uVar23);
                    }
                  }
                  fVar9 = ent_cont(*(float32 **)(local_f8[uVar20] + sVar19 * 8),
                                   *(float32 **)(local_100[uVar20] + sVar19 * 8),uVar2);
                  fVar10 = ent_cont(*(float32 **)(local_108[uVar20] + sVar19 * 8),
                                    *(float32 **)(local_110[uVar20] + sVar19 * 8),veclen[sVar19]);
                  dStack_b0 = auVar11._8_8_;
                  dVar12 = dVar12 + (double)fVar10 * dVar33;
                  dStack_b0 = dStack_b0 + (double)fVar9 * dVar8;
                  sVar19 = sVar19 + 1;
                } while (sVar19 != d2);
                dStack_b0 = dStack_b0 + dVar12;
LAB_00111c25:
                dStack_b0 = (double)(float)stwt[uVar20] * dStack_b0;
              }
              dVar31 = dVar31 + dStack_b0;
              uVar20 = uVar20 + 1;
              bVar24 = d1 <= uVar20;
              if ((uVar20 == d1) || (n_density == 0)) break;
            }
          }
          if (iVar13 == 0) {
            dVar31 = dVar31 - (double)node_wt_ent;
          }
          if ((bVar24) && (dVar30 < dVar31)) {
            local_d8 = local_124;
            local_98 = local_c8;
            dVar30 = dVar31;
            local_dc = uVar22;
          }
        }
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 != n_all_q);
    if (local_d8 != 0 && local_dc != 0) {
      ptr = __ckd_calloc__((ulong)local_dc,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                           ,0x112);
      ptr_00 = __ckd_calloc__((ulong)local_d8,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                              ,0x113);
      sVar18 = d1 * d2 * uVar16 * 4;
      local_130 = 0;
      memset(*(void **)*inptr,0,sVar18);
      memset(*(void **)*inptr_00,0,sVar18);
      if (n_id != 0) {
        uVar20 = 0;
        uVar22 = 0;
        do {
          uVar2 = id[uVar20];
          iVar14 = eval_quest(all_q + (local_98 & 0xffffffff),dfeat[uVar2],n_dfeat);
          if (iVar14 == 0) {
            if (n_state != 0) {
              uVar17 = 0;
              do {
                if (n_stream != 0) {
                  sVar19 = 0;
                  do {
                    if (n_density != 0) {
                      pfVar4 = mixw[uVar2][uVar17][sVar19];
                      lVar1 = *(long *)(inptr_00[uVar17] + sVar19 * 8);
                      uVar23 = 0;
                      do {
                        *(float *)(lVar1 + uVar23 * 4) =
                             (float)pfVar4[uVar23] + *(float *)(lVar1 + uVar23 * 4);
                        uVar23 = uVar23 + 1;
                      } while (uVar16 != uVar23);
                    }
                    sVar19 = sVar19 + 1;
                  } while (sVar19 != d2);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != d1);
            }
            *(uint *)((long)ptr_00 + local_130 * 4) = uVar2;
            local_130 = (ulong)((int)local_130 + 1);
          }
          else {
            if (n_state != 0) {
              uVar17 = 0;
              do {
                if (n_stream != 0) {
                  sVar19 = 0;
                  do {
                    if (n_density != 0) {
                      pfVar4 = mixw[uVar2][uVar17][sVar19];
                      lVar1 = *(long *)(inptr[uVar17] + sVar19 * 8);
                      uVar23 = 0;
                      do {
                        *(float *)(lVar1 + uVar23 * 4) =
                             (float)pfVar4[uVar23] + *(float *)(lVar1 + uVar23 * 4);
                        uVar23 = uVar23 + 1;
                      } while (uVar16 != uVar23);
                    }
                    sVar19 = sVar19 + 1;
                  } while (sVar19 != d2);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != d1);
            }
            *(uint *)((long)ptr + (ulong)uVar22 * 4) = uVar2;
            uVar22 = uVar22 + 1;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != n_id);
      }
      ckd_free_3d(inptr);
      ckd_free(ptr);
      ckd_free_3d(inptr_00);
      ckd_free(ptr_00);
      if (iVar13 == 0) {
        ckd_free_3d(local_f8);
        ckd_free_3d(local_100);
        ckd_free_3d(local_108);
        ckd_free_3d(local_110);
      }
      pqVar21 = all_q + (local_98 & 0xffffffff);
      uVar28 = SUB84(dVar30,0);
      uVar29 = (undefined4)((ulong)dVar30 >> 0x20);
      goto LAB_00111f0e;
    }
  }
  uVar28 = 0;
  uVar29 = 0;
  pqVar21 = (quest_t *)0x0;
LAB_00111f0e:
  *out_best_q = pqVar21;
  return (float64)CONCAT44(uVar29,uVar28);
}

Assistant:

float64
best_q(float32 ****mixw,
       float32 ****means,
       float32 ****vars,
       uint32  *veclen,
       uint32 n_model,
       uint32 n_state,
       uint32 n_stream,
       uint32 n_density,
       float32 *stwt,
       uint32 **dfeat,
       uint32 n_dfeat,
       quest_t *all_q,
       uint32 n_all_q,
       pset_t *pset,
       uint32 *id,
       uint32 n_id,
       float32 ***dist,
       float64 node_wt_ent,  /* Weighted entropy of node */
       quest_t **out_best_q)
{
    float32 ***yes_dist;
    float32 ***yes_means=0;
    float32 ***yes_vars=0;
    float32 varfloor=0;
    float64 y_ent;
    float64 yes_dnom, yes_norm;
    uint32 *yes_id;
    float32 ***no_dist;
    float32 ***no_means=0;
    float32 ***no_vars=0;
    float64 n_ent;
    float64 no_dnom, no_norm;
    uint32 *no_id;
    uint32 n_yes, n_b_yes = 0;
    uint32 n_no, n_b_no = 0;
    uint32 i, j, k, q, b_q=0, s;
    uint32 ii;
    float64 einc, b_einc = -1.0e+50;

    const char*  type;
    uint32 continuous, sumveclen=0;

    type = cmd_ln_str("-ts2cbfn");
    if (strcmp(type,".semi.")!=0 && strcmp(type,".cont.") != 0)
        E_FATAL("Type %s unsupported; trees can only be built on types .semi. or .cont.\n",type);
    if (strcmp(type,".cont.") == 0)
        continuous = 1;
    else
        continuous = 0;

    if (continuous == 1) {
        varfloor = cmd_ln_float32("-varfloor");
        /* Allocating for sumveclen is overallocation, but it eases coding */
        for (ii=0,sumveclen=0;ii<n_stream;ii++) sumveclen += veclen[ii];
        yes_means = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        yes_vars = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        no_means = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        no_vars = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
    }

    n_yes = n_no = 0;

    yes_dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));
    no_dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));

    for (q = 0; q < n_all_q; q++) {
	memset(&yes_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
	memset(&no_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);

        if (continuous == 1) {
	    memset(&yes_means[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&yes_vars[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&no_means[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&no_vars[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
        }

	n_yes = n_no = 0;

	for (ii = 0; ii < n_id; ii++) {
	    i = id[ii];
	    if (eval_quest(&all_q[q], dfeat[i], n_dfeat)) {
	        for (s = 0; s < n_state; s++) {
		    for (j = 0; j < n_stream; j++) {
			for (k = 0; k < n_density; k++) {
			    yes_dist[s][j][k] += mixw[i][s][j][k];
			}
		    }
		}
                if (continuous == 1) {
	            for (s = 0; s < n_state; s++) {
		        for (j = 0; j < n_stream; j++) {
			    for (k = 0; k < veclen[j]; k++) {
                                yes_means[s][j][k] += mixw[i][s][j][0] * means[i][s][j][k];
                                yes_vars[s][j][k] += mixw[i][s][j][0] * (vars[i][s][j][k] + means[i][s][j][k]*means[i][s][j][k]);
			    }
		        }
		    }
		}
		++n_yes;
	    }
	    else {
		for (s = 0; s < n_state; s++) {
		    for (j = 0; j < n_stream; j++) {
			for (k = 0; k < n_density; k++) {
			    no_dist[s][j][k] += mixw[i][s][j][k];
			}
		    }
		}
                if (continuous == 1) {
	            for (s = 0; s < n_state; s++) {
		        for (j = 0; j < n_stream; j++) {
			    for (k = 0; k < veclen[j]; k++) {
                                no_means[s][j][k] += mixw[i][s][j][0] * means[i][s][j][k];
                                no_vars[s][j][k] += mixw[i][s][j][0] * (vars[i][s][j][k] + means[i][s][j][k]*means[i][s][j][k]);
			    }
		        }
		    }
		}
		++n_no;
	    }
	}
	
	if ((n_yes == 0) || (n_no == 0)) {
	    /* no split.  All satisfy or all don't satisfy */
	    continue;
	}


	for (s = 0, einc = 0; s < n_state; s++) {
	    for (k = 0, yes_dnom = 0; k < n_density; k++) {
		yes_dnom += yes_dist[s][0][k];
	    }
	
	    if (yes_dnom == 0)
	      break;

	    yes_norm = 1.0 / yes_dnom;
	
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    yes_dist[s][j][k] *= yes_norm;
		}
	    }
	
	    for (k = 0, no_dnom = 0; k < n_density; k++) {
		no_dnom += no_dist[s][0][k];
	    }
	
	    if (no_dnom == 0)
	      break;

	    no_norm = 1.0 / no_dnom;
	    
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    no_dist[s][j][k] *= no_norm;
		}
	    }

            if (continuous == 1) {
                y_ent = 0;
                n_ent = 0;
	        for (j = 0; j < n_stream; j++) {
                    if (yes_dnom != 0) {
   		        for (k = 0; k < veclen[j]; k++) {
                            yes_means[s][j][k] *= yes_norm;
                            yes_vars[s][j][k] = yes_vars[s][j][k]*yes_norm - 
                                          yes_means[s][j][k]*yes_means[s][j][k];
                            if (yes_vars[s][j][k] < varfloor) yes_vars[s][j][k] = varfloor;
                        }
                    }
                    if (no_dnom != 0) {
   		        for (k = 0; k < veclen[j]; k++) {
                            no_means[s][j][k] *= no_norm;
                            no_vars[s][j][k] = no_vars[s][j][k]*no_norm - 
                                            no_means[s][j][k]*no_means[s][j][k];
                            if (no_vars[s][j][k] < varfloor) no_vars[s][j][k] = varfloor;
                        }
                    }
                    y_ent +=  yes_dnom * ent_cont(yes_means[s][j],yes_vars[s][j],veclen[j]);
                    n_ent +=  no_dnom * ent_cont(no_means[s][j],no_vars[s][j],veclen[j]);
                }
                einc += (float64)stwt[s] * (y_ent + n_ent);
            }
            else {
	        einc += (float64)stwt[s] * wt_ent_inc(yes_dist[s], yes_dnom,
	    				     no_dist[s], no_dnom,
					     dist[s], n_stream, n_density);
            }
	}

        if (continuous == 1) {
            einc -=  node_wt_ent;
        }

	if (s < n_state) {
	  /* Ended iteration over states prematurely; assume 'bad' question */
	  continue;
	}
	
	if (einc > b_einc) {
	    b_einc = einc;
	    b_q = q;
	    n_b_yes = n_yes;
	    n_b_no = n_no;
	}
    }

    if ((n_b_yes == 0) || (n_b_no == 0)) {
	/* No best question */
	*out_best_q = NULL;

	return 0;
    }

    yes_id = (uint32 *)ckd_calloc(n_b_yes, sizeof(uint32));
    no_id  = (uint32 *)ckd_calloc(n_b_no, sizeof(uint32));

    memset(&yes_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
    memset(&no_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
    n_yes = n_no = 0;

    for (ii = 0; ii < n_id; ii++) {
	i = id[ii];
	if (eval_quest(&all_q[b_q], dfeat[i], n_dfeat)) {
	    for (s = 0; s < n_state; s++) {
		for (j = 0; j < n_stream; j++) {
		    for (k = 0; k < n_density; k++) {
			yes_dist[s][j][k] += mixw[i][s][j][k];
		    }
		}
	    }
	    yes_id[n_yes] = i;
	    ++n_yes;
	}
	else {
	    for (s = 0; s < n_state; s++) {
		for (j = 0; j < n_stream; j++) {
		    for (k = 0; k < n_density; k++) {
			no_dist[s][j][k] += mixw[i][s][j][k];
		    }
		}
	    }
	    no_id[n_no] = i;
	    ++n_no;
	}
    }
    
    ckd_free_3d((void ***)yes_dist);
    ckd_free((void *)yes_id);
    ckd_free_3d((void ***)no_dist);
    ckd_free((void *)no_id);

    if (continuous == 1) {
        ckd_free_3d((void ***)yes_means);
        ckd_free_3d((void ***)yes_vars);
        ckd_free_3d((void ***)no_means);
        ckd_free_3d((void ***)no_vars);
    }

    *out_best_q = &all_q[b_q];

    return b_einc;
}